

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O2

PatternList *
parse_seq(PatternList *__return_storage_ptr__,Tokens *tokens,
         vector<docopt::Option,_std::allocator<docopt::Option>_> *options)

{
  string *prefix;
  pointer *ppsVar1;
  size_type sVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  bool bVar3;
  string *psVar4;
  DocoptLanguageError *pDVar5;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *pvVar6;
  string local_d8;
  undefined1 local_b8 [8];
  PatternList expr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  undefined1 local_90 [8];
  string trailing;
  back_insert_iterator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  local_50;
  undefined1 auStack_48 [8];
  PatternList atom;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.container = __return_storage_ptr__;
  do {
    if ((ulong)((long)(tokens->fTokens).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(tokens->fTokens).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= tokens->fIndex) {
      return (PatternList *)
             (vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
              *)local_50.container;
    }
    psVar4 = Tokens::current_abi_cxx11_(tokens);
    bVar3 = std::operator==(psVar4,"]");
    if (bVar3) {
      return (PatternList *)
             (vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
              *)local_50.container;
    }
    bVar3 = std::operator==(psVar4,")");
    if (bVar3) {
      return (PatternList *)
             (vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
              *)local_50.container;
    }
    bVar3 = std::operator==(psVar4,"|");
    if (bVar3) {
      return (PatternList *)
             (vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
              *)local_50.container;
    }
    psVar4 = Tokens::current_abi_cxx11_(tokens);
    auStack_48 = (undefined1  [8])0x0;
    atom.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    atom.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar3 = std::operator==(psVar4,"[");
    if (bVar3) {
      Tokens::pop_abi_cxx11_((string *)(trailing.field_2._M_local_buf + 8),tokens);
      std::__cxx11::string::~string((string *)(trailing.field_2._M_local_buf + 8));
      parse_expr((PatternList *)local_b8,tokens,options);
      Tokens::pop_abi_cxx11_((string *)local_90,tokens);
      bVar3 = std::operator!=((string *)local_90,"]");
      if (bVar3) {
        pDVar5 = (DocoptLanguageError *)__cxa_allocate_exception(0x10);
        docopt::DocoptLanguageError::runtime_error(pDVar5,"Mismatched \'[\'");
        __cxa_throw(pDVar5,&docopt::DocoptLanguageError::typeinfo,std::runtime_error::~runtime_error
                   );
      }
      ppsVar1 = &expr.
                 super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      make_shared<docopt::Optional,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                ((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  *)ppsVar1);
      std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
      ::emplace_back<std::shared_ptr<docopt::Optional>>
                ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                  *)auStack_48,(shared_ptr<docopt::Optional> *)ppsVar1);
LAB_00186cc3:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
      std::__cxx11::string::~string((string *)local_90);
      pvVar6 = (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                *)local_b8;
LAB_00186ce2:
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector(pvVar6);
    }
    else {
      bVar3 = std::operator==(psVar4,"(");
      if (bVar3) {
        Tokens::pop_abi_cxx11_((string *)(trailing.field_2._M_local_buf + 8),tokens);
        std::__cxx11::string::~string((string *)(trailing.field_2._M_local_buf + 8));
        parse_expr((PatternList *)local_b8,tokens,options);
        Tokens::pop_abi_cxx11_((string *)local_90,tokens);
        bVar3 = std::operator!=((string *)local_90,")");
        if (bVar3) {
          pDVar5 = (DocoptLanguageError *)__cxa_allocate_exception(0x10);
          docopt::DocoptLanguageError::runtime_error(pDVar5,"Mismatched \'(\'");
          __cxa_throw(pDVar5,&docopt::DocoptLanguageError::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        ppsVar1 = &expr.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::
        make_shared<docopt::Required,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                  ((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)ppsVar1);
        std::
        vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
        emplace_back<std::shared_ptr<docopt::Required>>
                  ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                    *)auStack_48,(shared_ptr<docopt::Required> *)ppsVar1);
        goto LAB_00186cc3;
      }
      bVar3 = std::operator==(psVar4,"options");
      if (!bVar3) {
        prefix = (string *)(&trailing.field_2._M_allocated_capacity + 1);
        std::__cxx11::string::string((string *)prefix,"--",(allocator *)local_90);
        bVar3 = anon_unknown.dwarf_1336db::starts_with(psVar4,prefix);
        if (!bVar3) {
          std::__cxx11::string::~string((string *)prefix);
LAB_00186e1d:
          std::__cxx11::string::string((string *)prefix,"-",(allocator *)local_90);
          bVar3 = anon_unknown.dwarf_1336db::starts_with(psVar4,prefix);
          if ((bVar3) && (bVar3 = std::operator!=(psVar4,"-"), bVar3)) {
            bVar3 = std::operator!=(psVar4,"--");
            std::__cxx11::string::~string((string *)(trailing.field_2._M_local_buf + 8));
            if (bVar3) {
              parse_short((PatternList *)((long)&trailing.field_2 + 8),tokens,options);
              goto LAB_00186e8f;
            }
          }
          else {
            std::__cxx11::string::~string((string *)(trailing.field_2._M_local_buf + 8));
          }
          sVar2 = psVar4->_M_string_length;
          if ((sVar2 == 0) ||
             (((__first._M_current = (psVar4->_M_dataplus)._M_p, *__first._M_current != '<' ||
               (__first._M_current[sVar2 - 1] != '>')) &&
              (bVar3 = std::
                       all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,int(*)(int)>
                                 (__first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           )(__first._M_current + sVar2),isupper), !bVar3)))) {
            Tokens::pop_abi_cxx11_((string *)((long)&trailing.field_2 + 8),tokens);
            std::make_shared<docopt::Command,std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                      );
            std::
            vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
            ::emplace_back<std::shared_ptr<docopt::Command>>
                      ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                        *)auStack_48,(shared_ptr<docopt::Command> *)local_90);
          }
          else {
            Tokens::pop_abi_cxx11_((string *)((long)&trailing.field_2 + 8),tokens);
            std::make_shared<docopt::Argument,std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                      );
            std::
            vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
            ::emplace_back<std::shared_ptr<docopt::Argument>>
                      ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                        *)auStack_48,(shared_ptr<docopt::Argument> *)local_90);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&trailing);
          std::__cxx11::string::~string((string *)(trailing.field_2._M_local_buf + 8));
          goto LAB_00186ce7;
        }
        bVar3 = std::operator!=(psVar4,"--");
        std::__cxx11::string::~string((string *)prefix);
        if (!bVar3) goto LAB_00186e1d;
        parse_long((PatternList *)prefix,tokens,options);
LAB_00186e8f:
        pvVar6 = (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  *)((long)&trailing.field_2 + 8);
        std::
        vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ::_M_move_assign((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                          *)auStack_48,pvVar6);
        goto LAB_00186ce2;
      }
      Tokens::pop_abi_cxx11_((string *)(trailing.field_2._M_local_buf + 8),tokens);
      std::__cxx11::string::~string((string *)(trailing.field_2._M_local_buf + 8));
      std::make_shared<docopt::OptionsShortcut>();
      std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
      ::emplace_back<std::shared_ptr<docopt::OptionsShortcut>>
                ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                  *)auStack_48,(shared_ptr<docopt::OptionsShortcut> *)local_90);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&trailing);
    }
LAB_00186ce7:
    psVar4 = Tokens::current_abi_cxx11_(tokens);
    bVar3 = std::operator==(psVar4,"...");
    if (bVar3) {
      pvVar6 = (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                *)((long)&trailing.field_2 + 8);
      std::
      make_shared<docopt::OneOrMore,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                (pvVar6);
      std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
      ::emplace_back<std::shared_ptr<docopt::OneOrMore>>
                ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                  *)local_50.container,(shared_ptr<docopt::OneOrMore> *)pvVar6);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff98);
      Tokens::pop_abi_cxx11_(&local_d8,tokens);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    else {
      std::__copy_move<true,false,std::random_access_iterator_tag>::
      __copy_m<std::shared_ptr<docopt::Pattern>*,std::back_insert_iterator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                ((shared_ptr<docopt::Pattern> *)auStack_48,
                 atom.
                 super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,local_50);
    }
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)auStack_48);
  } while( true );
}

Assistant:

static PatternList parse_seq(Tokens& tokens, std::vector<Option>& options)
{
	// seq ::= ( atom [ '...' ] )* ;"""

	PatternList ret;

	while (tokens) {
		auto const& token = tokens.current();

		if (token=="]" || token==")" || token=="|")
			break;

		auto atom = parse_atom(tokens, options);
		if (tokens.current() == "...") {
			ret.emplace_back(std::make_shared<OneOrMore>(std::move(atom)));
			tokens.pop();
		} else {
			std::move(atom.begin(), atom.end(), std::back_inserter(ret));
		}
	}

	return ret;
}